

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O0

void __thiscall PlanePart::PlanePart(PlanePart *this)

{
  PlanePart *this_local;
  
  this->pente0 = 0.1;
  this->pente1 = 1.0;
  this->seuil = 3.0;
  this->probaP0 = 0.9;
  this->frequency = 0.0;
  this->whichPente = false;
  return;
}

Assistant:

PlanePart::PlanePart() {
    frequency = 0;
    whichPente = false;
}